

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::upperword(Forth *this)

{
  byte bVar1;
  byte __c;
  uint uVar2;
  int iVar3;
  Cell CVar4;
  Cell CVar5;
  allocator<char> local_79;
  string wordBuffer;
  string local_50;
  
  requireDStackDepth(this,1,"UPPERWORD");
  uVar2 = ForthStack<unsigned_int>::getTop(&this->dStack);
  wordBuffer._M_dataplus._M_p = (pointer)&wordBuffer.field_2;
  wordBuffer._M_string_length = 0;
  wordBuffer.field_2._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&wordBuffer,'\0');
  iVar3 = getSourceBufferRemain(this);
  if (0 < iVar3) {
    CVar4 = getSourceAddress(this);
    CVar5 = getSourceBufferOffset(this);
    bVar1 = dataSpaceAt(this,CVar5 + CVar4);
    while( true ) {
      iVar3 = getSourceBufferRemain(this);
      if (iVar3 < 1) break;
      if ((int)(char)uVar2 != (uint)bVar1) {
        if ((uVar2 & 0xff) != 0x20) break;
        iVar3 = isspace((uint)bVar1);
        if (iVar3 == 0) break;
      }
      incSourceBufferOffset(this);
      CVar4 = getSourceAddress(this);
      CVar5 = getSourceBufferOffset(this);
      bVar1 = dataSpaceAt(this,CVar5 + CVar4);
    }
  }
  iVar3 = getSourceBufferRemain(this);
  if (0 < iVar3) {
    while( true ) {
      iVar3 = getSourceBufferRemain(this);
      if (iVar3 < 1) break;
      CVar4 = getSourceAddress(this);
      CVar5 = getSourceBufferOffset(this);
      bVar1 = dataSpaceAt(this,CVar5 + CVar4);
      if ((int)(char)uVar2 == (uint)bVar1) break;
      if ((uVar2 & 0xff) == 0x20) {
        iVar3 = isspace((uint)bVar1);
        if (iVar3 != 0) break;
      }
      __c = bVar1 - 0x20;
      if (0x19 < (byte)(bVar1 + 0x9f)) {
        __c = bVar1;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&wordBuffer,__c);
      incSourceBufferOffset(this);
    }
    iVar3 = getSourceBufferRemain(this);
    if (0 < iVar3) {
      incSourceBufferOffset(this);
    }
  }
  if (wordBuffer._M_string_length < 0x100) {
    *wordBuffer._M_dataplus._M_p = (char)wordBuffer._M_string_length + -1;
    moveIntoDataSpace(this,this->VarOffsetWordBuffer,wordBuffer._M_dataplus._M_p,
                      wordBuffer._M_string_length);
    ForthStack<unsigned_int>::setTop(&this->dStack,this->VarOffsetWordBuffer);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"WORD: very long word ",&local_79);
    throwMessage(this,&local_50,errorParsedStringOverflow);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::~string((string *)&wordBuffer);
  return;
}

Assistant:

void  upperword() {
			REQUIRE_DSTACK_DEPTH(1, "UPPERWORD");
			auto delim = static_cast<char>(dStack.getTop());
			/****

			I need a buffer to store the result of the Forth `WORD` word.  As with the
			input buffer, I use a `std::string` so I don't need to worry about memory
			management.

			Note that while this is a `std::string`, its format is not a typical strings.
			The buffer returned by `WORD` has the word length as its first character.
			That is, it is a Forth _counted string_.

			****/

			std::string wordBuffer{};
			wordBuffer.push_back(0);  // First char of buffer is length.
			
				// Skip leading delimiters
				if (getSourceBufferRemain() > 0) {
					auto currentChar = getDataChar(getSourceAddress() + getSourceBufferOffset());
					while (getSourceBufferRemain() > 0 && ((currentChar == delim)
						|| (delim == ' ' && isspace(static_cast<unsigned char>(currentChar)))
						)) {
						incSourceBufferOffset();
						currentChar = getDataChar(getSourceAddress() + getSourceBufferOffset());
					}
				}
				if (getSourceBufferRemain() > 0) {
					// Copy characters until we see the delimiter again.
					while (getSourceBufferRemain() >0 ) {
						auto currentChar = getDataChar(getSourceAddress() + getSourceBufferOffset());	
						if( currentChar != delim
						&& !(delim == ' ' && (isspace(static_cast<unsigned char>(currentChar))))
						) {
						wordBuffer.push_back(toupper_ascii(static_cast<unsigned char>(currentChar)));
						incSourceBufferOffset();
						} else {
							break;
						}
					}
					// source point to the delimiter char, skip it.
					if (getSourceBufferRemain() >0 ) {
						incSourceBufferOffset(); 
					}
				}
				if (wordBuffer.size() > 255){
					// @bug it is catched below
					throwMessage(std::string("WORD: very long word "), errorParsedStringOverflow);
					return;
				}
				// Update the count at the beginning of the buffer.
				wordBuffer[0] = static_cast<char>(wordBuffer.size() - 1);
				// copy to fixed buffer
				moveIntoDataSpace(VarOffsetWordBuffer, wordBuffer.c_str(), wordBuffer.size());
				dStack.setTop(CELL(VarOffsetWordBuffer));
		}